

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSet.cpp
# Opt level: O0

bool __thiscall HSet::add(HSet *this,HighsInt entry)

{
  value_type vVar1;
  int iVar2;
  reference pvVar3;
  size_type sVar4;
  int in_ESI;
  vector<int,_std::allocator<int>_> *in_RDI;
  HighsInt size;
  HighsInt ix;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int in_stack_ffffffffffffffe8;
  vector<int,_std::allocator<int>_> *this_00;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar5;
  
  if (in_ESI < 0) {
    bVar5 = false;
  }
  else {
    this_00 = in_RDI;
    if (((ulong)in_RDI[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish & 1) == 0) {
      setup((HSet *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
            (HighsInt)((ulong)in_RDI >> 0x20),(HighsInt)in_RDI,SUB41((uint)in_ESI >> 0x18,0),
            (FILE *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
            SUB81((ulong)in_RDI >> 0x38,0),SUB81((ulong)in_RDI >> 0x30,0));
    }
    if (*(int *)&in_RDI[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start < in_ESI) {
      std::vector<int,_std::allocator<int>_>::resize
                (this_00,CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
      in_stack_ffffffffffffffe8 =
           *(int *)&in_RDI[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
      while (in_stack_ffffffffffffffe8 = in_stack_ffffffffffffffe8 + 1,
            in_stack_ffffffffffffffe8 < in_ESI) {
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)
                            &in_RDI[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish,(long)in_stack_ffffffffffffffe8);
        *pvVar3 = -1;
      }
      *(int *)&in_RDI[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start = in_ESI;
    }
    else {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)
                          &in_RDI[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,(long)in_ESI);
      if (-1 < *pvVar3) {
        if (((ulong)in_RDI[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish & 0x100) != 0) {
          debug((HSet *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
        }
        return false;
      }
    }
    sVar4 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)
                       &(in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish);
    if (*(int *)&(in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start == (int)sVar4) {
      std::vector<int,_std::allocator<int>_>::resize
                (this_00,CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
    }
    vVar1 = *(value_type *)
             &(in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)
                        &in_RDI[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,(long)in_ESI);
    *pvVar3 = vVar1;
    iVar2 = *(int *)&(in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
    *(int *)&(in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start = iVar2 + 1;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)
                        &(in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish,(long)iVar2);
    *pvVar3 = in_ESI;
    if (((ulong)in_RDI[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish & 0x100) != 0) {
      debug((HSet *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
    }
    bVar5 = true;
  }
  return bVar5;
}

Assistant:

bool HSet::add(const HighsInt entry) {
  if (entry < min_entry) return false;
  if (!setup_) setup(1, entry);
  if (entry > max_entry_) {
    // Entry exceeds what's allowable so far so can't be in the list
    pointer_.resize(entry + 1);
    for (HighsInt ix = max_entry_ + 1; ix < entry; ix++)
      pointer_[ix] = no_pointer;
    max_entry_ = entry;
  } else if (pointer_[entry] > no_pointer) {
    // Duplicate
    if (debug_) debug();
    return false;
  }
  // New entry
  HighsInt size = entry_.size();
  if (count_ == size) {
    size++;
    entry_.resize(size);
  }
  pointer_[entry] = count_;
  entry_[count_++] = entry;
  if (debug_) debug();
  return true;
}